

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O3

optional<NFastBernoulli::TExecutionPlan> *
NFastBernoulli::Quantize
          (optional<NFastBernoulli::TExecutionPlan> *__return_storage_ptr__,double prob,double tol)

{
  undefined1 uVar1;
  double dVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined8 *puVar5;
  size_t sVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  undefined1 local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  size_t local_18;
  size_t local_10;
  
  local_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  dVar11 = 0.0;
  dVar12 = 1.0;
  lVar9 = 1;
  sVar6 = 0;
  sVar8 = 1;
  lVar10 = 0;
  while ((tol < prob - dVar11 || (tol < dVar12 - prob))) {
    dVar2 = (dVar12 - dVar11) * 0.5 + dVar11;
    if ((dVar2 == prob) && (!NAN(dVar2) && !NAN(prob))) {
      local_18 = sVar6;
      local_10 = sVar8;
      puVar5 = (undefined8 *)(&local_59 + sVar6);
      if (&local_58 < puVar5 && sVar6 != 0) {
        puVar3 = &local_58;
        do {
          puVar7 = (undefined8 *)((long)puVar3 + 1);
          uVar1 = *(undefined1 *)puVar3;
          *(undefined1 *)puVar3 = *(undefined1 *)puVar5;
          *(undefined1 *)puVar5 = uVar1;
          puVar5 = (undefined8 *)((long)puVar5 + -1);
          puVar3 = puVar7;
        } while (puVar7 < puVar5);
      }
      goto LAB_001034da;
    }
    if (prob <= dVar2) {
      if (dVar2 <= prob) {
        dVar2 = dVar12;
      }
    }
    else {
      *(undefined1 *)((long)&local_58 + lVar10) = 0;
      sVar6 = sVar6 + 1;
      prob = 1.0 - prob;
      dVar11 = 1.0 - dVar12;
      lVar10 = lVar9;
      dVar2 = 1.0 - dVar2;
    }
    dVar12 = dVar2;
    *(undefined1 *)((long)&local_58 + lVar10) = 1;
    sVar6 = sVar6 + 1;
    sVar8 = sVar8 + 1;
    lVar9 = lVar10 + 2;
    bVar4 = 0x3d < lVar10;
    lVar10 = lVar10 + 1;
    if (bVar4) goto code_r0x00103437;
  }
  local_18 = sVar6;
  local_10 = sVar8;
  puVar5 = (undefined8 *)(&local_59 + sVar6);
  if (&local_58 < puVar5 && sVar6 != 0) {
    puVar3 = &local_58;
    do {
      puVar7 = (undefined8 *)((long)puVar3 + 1);
      uVar1 = *(undefined1 *)puVar3;
      *(undefined1 *)puVar3 = *(undefined1 *)puVar5;
      *(undefined1 *)puVar5 = uVar1;
      puVar5 = (undefined8 *)((long)puVar5 + -1);
      puVar3 = puVar7;
    } while (puVar7 < puVar5);
  }
LAB_001034da:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x30) = uStack_28;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x38) = uStack_20;
  (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
  _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.NoOps_
       = local_18;
  (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
  _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
  NoSrcBlocks_ = local_10;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x20) = local_38;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x28) = uStack_30;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x30) = uStack_28;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x38) = uStack_20;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
    _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload = local_58;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 8)
       = uStack_50;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x10) = uStack_48;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>
           )._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload +
   0x18) = uStack_40;
  bVar4 = true;
LAB_001034fc:
  (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
  _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = bVar4;
  return __return_storage_ptr__;
code_r0x00103437:
  bVar4 = false;
  goto LAB_001034fc;
}

Assistant:

std::optional<TExecutionPlan> Quantize(double prob, double tol) noexcept {
    TExecutionPlan plan{.NoSrcBlocks_ = 1};
    double lhs = 0.0, rhs = 1.0;
    for (auto it = plan.Ops_.begin(); it + 1 < plan.Ops_.end(); ++it) {
        if (prob - lhs <= tol && rhs - prob <= tol) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        }

        double mid = lhs + 0.5 * (rhs - lhs);

        if (mid == prob) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        } else if (prob > mid) {
            *(it++) = EOp::Not;
            ++plan.NoOps_;
            prob = 1 - prob;
            lhs = 1 - rhs;
            rhs = 1 - mid;
        } else if (prob < mid) {
            rhs = mid;
        }

        // In any case append AND operation.
        *it = EOp::And;
        ++plan.NoOps_;
        ++plan.NoSrcBlocks_;
    }
    return std::nullopt;
}